

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperBase::Reset(ClipperBase *this)

{
  undefined8 *local_20;
  TEdge *e;
  LocalMinima *lm;
  ClipperBase *this_local;
  
  this->m_CurrentLM = this->m_MinimaList;
  if (this->m_CurrentLM != (LocalMinima *)0x0) {
    for (e = (TEdge *)this->m_MinimaList; e != (TEdge *)0x0; e = (TEdge *)e->ycurr) {
      for (local_20 = (undefined8 *)e->ybot; local_20 != (undefined8 *)0x0;
          local_20 = (undefined8 *)local_20[0xd]) {
        local_20[2] = *local_20;
        local_20[3] = local_20[1];
        *(undefined4 *)((long)local_20 + 0x44) = 1;
        *(undefined4 *)((long)local_20 + 0x54) = 0xffffffff;
      }
      for (local_20 = (undefined8 *)e->xcurr; local_20 != (undefined8 *)0x0;
          local_20 = (undefined8 *)local_20[0xd]) {
        local_20[2] = *local_20;
        local_20[3] = local_20[1];
        *(undefined4 *)((long)local_20 + 0x44) = 2;
        *(undefined4 *)((long)local_20 + 0x54) = 0xffffffff;
      }
    }
  }
  return;
}

Assistant:

void ClipperBase::Reset()
{
  m_CurrentLM = m_MinimaList;
  if( !m_CurrentLM ) return; //ie nothing to process

  //reset all edges ...
  LocalMinima* lm = m_MinimaList;
  while( lm )
  {
    TEdge* e = lm->leftBound;
    while( e )
    {
      e->xcurr = e->xbot;
      e->ycurr = e->ybot;
      e->side = esLeft;
      e->outIdx = -1;
      e = e->nextInLML;
    }
    e = lm->rightBound;
    while( e )
    {
      e->xcurr = e->xbot;
      e->ycurr = e->ybot;
      e->side = esRight;
      e->outIdx = -1;
      e = e->nextInLML;
    }
    lm = lm->next;
  }
}